

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,char *procname)

{
  GLFWbool GVar1;
  PFN_vkVoidFunction local_28;
  GLFWvkproc proc;
  char *procname_local;
  VkInstance instance_local;
  
  if (procname != (char *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      instance_local = (VkInstance)0x0;
    }
    else {
      GVar1 = _glfwInitVulkan(2);
      if (GVar1 == 0) {
        instance_local = (VkInstance)0x0;
      }
      else {
        local_28 = (*_glfw.vk.GetInstanceProcAddr)(instance,procname);
        if (local_28 == (PFN_vkVoidFunction)0x0) {
          local_28 = (PFN_vkVoidFunction)dlsym(_glfw.vk.handle,procname);
        }
        instance_local = local_28;
      }
    }
    return (GLFWvkproc)instance_local;
  }
  __assert_fail("procname != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/glfw/src/vulkan.c"
                ,0xf7,"GLFWvkproc glfwGetInstanceProcAddress(VkInstance, const char *)");
}

Assistant:

GLFWAPI GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,
                                              const char* procname)
{
    GLFWvkproc proc;
    assert(procname != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return NULL;

    proc = (GLFWvkproc) vkGetInstanceProcAddr(instance, procname);
#if defined(_GLFW_VULKAN_STATIC)
    if (!proc)
    {
        if (strcmp(procname, "vkGetInstanceProcAddr") == 0)
            return (GLFWvkproc) vkGetInstanceProcAddr;
    }
#else
    if (!proc)
        proc = (GLFWvkproc) _glfw_dlsym(_glfw.vk.handle, procname);
#endif

    return proc;
}